

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  XMLComment *comment;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
  XMLComment::XMLComment((XMLComment *)this_00,this);
  this_00->_memPool = &(this->_commentPool).super_MemPool;
  XMLNode::SetValue(this_00,str,false);
  return (XMLComment *)this_00;
}

Assistant:

XMLComment* XMLDocument::NewComment( const char* str )
{
    TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
    XMLComment* comment = new (_commentPool.Alloc()) XMLComment( this );
    comment->_memPool = &_commentPool;
    comment->SetValue( str );
    return comment;
}